

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

int Cut_CutFilterOld(Cut_Man_t *p,Cut_Cut_t *pList,Cut_Cut_t *pCut)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Cut_Cut_t **ppCVar9;
  
  uVar4 = *(uint *)pCut >> 0x1c;
  uVar5 = *(uint *)pList;
  uVar1 = uVar5 >> 0x1c;
  do {
    pCVar3 = pList;
    if ((pCVar3->uSign & ~pCut->uSign) == 0) {
      if (uVar5 < 0x10000000) {
LAB_0044f178:
        p->nCutsFilter = p->nCutsFilter + 1;
        Cut_CutRecycle(p,pCut);
        return 1;
      }
      uVar6 = 0;
      do {
        uVar8 = 0;
        if (0xfffffff < *(uint *)pCut) {
          uVar7 = 0;
          do {
            uVar8 = uVar7;
            if (*(uint *)((long)&pCVar3[1].field_0x0 + uVar6 * 4) ==
                *(uint *)(&pCut[1].field_0x0 + uVar7 * 4)) break;
            uVar7 = uVar7 + 1;
            uVar8 = (ulong)uVar4;
          } while (uVar4 != uVar7);
        }
        if ((uint)uVar8 == uVar4) break;
        uVar6 = uVar6 + 1;
        if (uVar6 == uVar1) goto LAB_0044f178;
      } while( true );
    }
    pList = pCVar3->pNext;
    if (pList == (Cut_Cut_t *)0x0) break;
    uVar5 = *(uint *)pList;
    uVar1 = uVar5 >> 0x1c;
  } while (uVar1 <= uVar4);
  if (pCVar3->pNext != pList) {
    __assert_fail("pPrev->pNext == pTemp",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                  ,0x110,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  if (pList == (Cut_Cut_t *)0x0) {
    pCVar2 = (Cut_Cut_t *)0x0;
  }
  else {
    pCVar2 = pList->pNext;
  }
  ppCVar9 = &pCVar3->pNext;
  if (pList != (Cut_Cut_t *)0x0) {
    do {
      pCVar3 = pCVar2;
      if ((pCut->uSign & ~pList->uSign) == 0) {
        if (0xfffffff < *(uint *)pCut) {
          uVar5 = *(uint *)pList >> 0x1c;
          uVar6 = 0;
          do {
            uVar8 = 0;
            if (0xfffffff < *(uint *)pList) {
              uVar7 = 0;
              do {
                uVar8 = uVar7;
                if (*(int *)(&pCut[1].field_0x0 + uVar6 * 4) ==
                    *(int *)(&pList[1].field_0x0 + uVar7 * 4)) break;
                uVar7 = uVar7 + 1;
                uVar8 = (ulong)uVar5;
              } while (uVar5 != uVar7);
            }
            if ((uint)uVar8 == uVar5) goto LAB_0044f21b;
            uVar6 = uVar6 + 1;
          } while (uVar6 != *(uint *)pCut >> 0x1c);
        }
        p->nCutsFilter = p->nCutsFilter + 1;
        p->nNodeCuts = p->nNodeCuts + -1;
        *ppCVar9 = pList->pNext;
        Cut_CutRecycle(p,pList);
      }
      else {
LAB_0044f21b:
        ppCVar9 = &pList->pNext;
      }
      if (pCVar3 == (Cut_Cut_t *)0x0) break;
      pCVar2 = pCVar3->pNext;
      pList = pCVar3;
    } while( true );
  }
  if (*ppCVar9 == (Cut_Cut_t *)0x0) {
    return 0;
  }
  __assert_fail("*ppTail == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                ,0x129,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
}

Assistant:

static inline int Cut_CutFilterOld( Cut_Man_t * p, Cut_Cut_t * pList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pPrev, * pTemp, * pTemp2, ** ppTail;

    // check if this cut is filtered out by smaller cuts
    pPrev = NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        if ( pTemp->nLeaves > pCut->nLeaves )
            break;
        pPrev = pTemp;
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
            continue;
        // check containment seriously
        if ( Cut_CutCheckDominance( pTemp, pCut ) )
        {
            p->nCutsFilter++;
            Cut_CutRecycle( p, pCut );
            return 1;
        }
    }
    assert( pPrev->pNext == pTemp );

    // filter out other cuts using this one
    ppTail = &pPrev->pNext;
    Cut_ListForEachCutSafe( pTemp, pTemp, pTemp2 )
    {
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
        {
            ppTail = &pTemp->pNext;
            continue;
        }
        // check containment seriously
        if ( Cut_CutCheckDominance( pCut, pTemp ) )
        {
            p->nCutsFilter++;
            p->nNodeCuts--;
            // skip the given cut in the list
            *ppTail = pTemp->pNext;
            // recycle pTemp
            Cut_CutRecycle( p, pTemp );
        }
        else
            ppTail = &pTemp->pNext;
    }
    assert( *ppTail == NULL );
    return 0;
}